

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PNGImageHandler.cpp
# Opt level: O3

PDFImageXObject *
CreateImageXObjectForData
          (png_structp png_ptr,png_infop info_ptr,png_bytep row,ObjectsContext *inObjectsContext)

{
  long ****pppplVar1;
  long ****pppplVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  png_uint_32 pVar7;
  png_uint_32 pVar8;
  EStatusCode EVar9;
  __jmp_buf_tag *__env;
  IndirectObjectsReferenceRegistry *pIVar10;
  ObjectIDType inObjectID;
  Trace *pTVar11;
  DictionaryContext *pDVar12;
  PDFStream *this;
  IByteWriter *pIVar13;
  PDFStream *pPVar14;
  ulong uVar15;
  string *psVar16;
  png_structp png_ptr_00;
  png_bytep ppVar17;
  ulong uVar18;
  OutputStreamTraits traits;
  OutputStringBufferStream alphaWriteStream;
  PDFImageXObjectList listOfImages;
  MyStringBuf alphaComponentsData;
  OutputStreamTraits local_128;
  ObjectIDType local_120;
  png_structp local_118;
  png_uint_32 local_10c;
  ulong local_108;
  png_bytep local_100;
  ObjectIDType local_f8;
  OutputStringBufferStream local_f0;
  png_bytep local_d8;
  ulong local_d0;
  ulong local_c8;
  ObjectsContext *local_c0;
  code *local_b8;
  long ***local_b0;
  long ***local_a8;
  undefined8 local_a0;
  undefined **local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  locale local_60 [8];
  undefined4 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  local_b0 = (long ***)&local_b0;
  local_a0 = 0;
  local_a8 = local_b0;
  __env = (__jmp_buf_tag *)png_set_longjmp_fn(png_ptr,longjmp,200);
  iVar6 = _setjmp(__env);
  if (iVar6 == 0) {
    pVar7 = png_get_image_width(png_ptr,info_ptr);
    pVar8 = png_get_image_height(png_ptr,info_ptr);
    bVar3 = png_get_color_type(png_ptr,info_ptr);
    bVar4 = png_get_bit_depth(png_ptr,info_ptr);
    bVar5 = png_get_channels(png_ptr,info_ptr);
    pIVar10 = ObjectsContext::GetInDirectObjectsRegistry(inObjectsContext);
    inObjectID = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar10);
    local_118 = png_ptr;
    if ((bVar3 & 4) == 0) {
      local_120 = 0;
    }
    else {
      pIVar10 = ObjectsContext::GetInDirectObjectsRegistry(inObjectsContext);
      local_120 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar10);
    }
    local_b8 = __assert_fail;
    local_98 = (undefined **)__assert_fail;
    local_90 = 0;
    uStack_88 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0;
    uStack_68 = 0;
    std::locale::locale(local_60);
    local_58 = 0x18;
    local_50 = local_40;
    local_48 = 0;
    local_40[0] = 0;
    local_98 = &PTR__stringbuf_003a7e18;
    local_f8 = inObjectID;
    EVar9 = ObjectsContext::StartNewIndirectObject(inObjectsContext,inObjectID);
    if (EVar9 == eSuccess) {
      pDVar12 = ObjectsContext::StartDictionary(inObjectsContext);
      DictionaryContext::WriteKey(pDVar12,&scType_abi_cxx11_);
      DictionaryContext::WriteNameValue(pDVar12,&scXObject_abi_cxx11_);
      DictionaryContext::WriteKey(pDVar12,&scSubType_abi_cxx11_);
      DictionaryContext::WriteNameValue(pDVar12,&scImage_abi_cxx11_);
      DictionaryContext::WriteKey(pDVar12,&scWidth_abi_cxx11_);
      local_108 = (ulong)pVar7;
      DictionaryContext::WriteIntegerValue(pDVar12,local_108);
      DictionaryContext::WriteKey(pDVar12,&scHeight_abi_cxx11_);
      local_c8 = (ulong)pVar8;
      DictionaryContext::WriteIntegerValue(pDVar12,local_c8);
      DictionaryContext::WriteKey(pDVar12,&scBitsPerComponent_abi_cxx11_);
      local_d0 = (ulong)bVar4;
      DictionaryContext::WriteIntegerValue(pDVar12,local_d0);
      DictionaryContext::WriteKey(pDVar12,&scColorSpace_abi_cxx11_);
      bVar4 = bVar5 - ((bVar3 & 4) >> 2);
      psVar16 = &scDeviceRGB_abi_cxx11_;
      if (bVar4 == 1) {
        psVar16 = &scDeviceGray_abi_cxx11_;
      }
      DictionaryContext::WriteNameValue(pDVar12,psVar16);
      if ((bVar3 & 4) != 0) {
        DictionaryContext::WriteKey(pDVar12,&scSMask_abi_cxx11_);
        DictionaryContext::WriteNewObjectReferenceValue(pDVar12,local_120);
      }
      this = ObjectsContext::StartPDFStream(inObjectsContext,pDVar12,false);
      pIVar13 = PDFStream::GetWriteStream(this);
      png_ptr_00 = local_118;
      if ((bVar3 & 4) == 0) {
        iVar6 = pVar8 + 1;
        while (iVar6 = iVar6 + -1, iVar6 != 0) {
          png_read_row(local_118,row,(png_bytep)0x0);
          (*pIVar13->_vptr_IByteWriter[2])(pIVar13,row,(ulong)(pVar7 * bVar4));
        }
      }
      else {
        local_100 = row;
        local_c0 = inObjectsContext;
        OutputStringBufferStream::OutputStringBufferStream(&local_f0,(MyStringBuf *)&local_98);
        if (pVar8 != 0) {
          local_d8 = (png_bytep)0x0;
          do {
            local_10c = pVar8;
            png_read_row(png_ptr_00,local_d8,local_100);
            if (pVar7 != 0) {
              uVar15 = 0;
              uVar18 = local_108;
              do {
                ppVar17 = local_100 + (uVar15 & 0xffffffff);
                (*pIVar13->_vptr_IByteWriter[2])(pIVar13,ppVar17,(ulong)bVar4);
                OutputStringBufferStream::Write(&local_f0,ppVar17 + bVar4,1);
                uVar15 = uVar15 + bVar5;
                uVar18 = uVar18 - 1;
              } while (uVar18 != 0);
            }
            pVar8 = local_10c - 1;
            png_ptr_00 = local_118;
          } while (pVar8 != 0);
        }
        OutputStringBufferStream::~OutputStringBufferStream(&local_f0);
        inObjectsContext = local_c0;
      }
      EVar9 = ObjectsContext::EndPDFStream(inObjectsContext,this);
      if (EVar9 == eSuccess) {
        if ((bVar3 & 4) != 0) {
          EVar9 = ObjectsContext::StartNewIndirectObject(inObjectsContext,local_120);
          if (EVar9 != eSuccess) {
            pTVar11 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar11,
                              "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld"
                              ,local_120);
            goto LAB_001de93d;
          }
          pDVar12 = ObjectsContext::StartDictionary(inObjectsContext);
          DictionaryContext::WriteKey(pDVar12,&scType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar12,&scXObject_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar12,&scSubType_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar12,&scImage_abi_cxx11_);
          DictionaryContext::WriteKey(pDVar12,&scWidth_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar12,local_108);
          DictionaryContext::WriteKey(pDVar12,&scHeight_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar12,local_c8);
          DictionaryContext::WriteKey(pDVar12,&scBitsPerComponent_abi_cxx11_);
          DictionaryContext::WriteIntegerValue(pDVar12,local_d0);
          DictionaryContext::WriteKey(pDVar12,&scColorSpace_abi_cxx11_);
          DictionaryContext::WriteNameValue(pDVar12,&scDeviceGray_abi_cxx11_);
          pPVar14 = ObjectsContext::StartPDFStream(inObjectsContext,pDVar12,false);
          pIVar13 = PDFStream::GetWriteStream(pPVar14);
          InputStringBufferStream::InputStringBufferStream
                    ((InputStringBufferStream *)&local_f0,(MyStringBuf *)&local_98);
          OutputStreamTraits::OutputStreamTraits(&local_128,pIVar13);
          OutputStreamTraits::CopyToOutputStream(&local_128,(IByteReader *)&local_f0);
          EVar9 = ObjectsContext::EndPDFStream(inObjectsContext,pPVar14);
          PDFStream::~PDFStream(pPVar14);
          operator_delete(pPVar14,0xf0);
          if (EVar9 != eSuccess) {
            pTVar11 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar11,
                              "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream"
                             );
            OutputStreamTraits::~OutputStreamTraits(&local_128);
            InputStringBufferStream::~InputStringBufferStream((InputStringBufferStream *)&local_f0);
            pPVar14 = (PDFStream *)0x0;
            goto LAB_001deb72;
          }
          OutputStreamTraits::~OutputStreamTraits(&local_128);
          InputStringBufferStream::~InputStringBufferStream((InputStringBufferStream *)&local_f0);
        }
        pPVar14 = (PDFStream *)operator_new(0x20);
        psVar16 = &KProcsetImageC_abi_cxx11_;
        if (bVar4 == 1) {
          psVar16 = &KProcsetImageB_abi_cxx11_;
        }
        EVar9 = eSuccess;
        PDFImageXObject::PDFImageXObject((PDFImageXObject *)pPVar14,local_f8,psVar16);
      }
      else {
        pTVar11 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar11,
                          "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream"
                         );
LAB_001de93d:
        pPVar14 = (PDFStream *)0x0;
      }
    }
    else {
      pTVar11 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar11,
                        "PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld"
                        ,local_f8);
      pPVar14 = (PDFStream *)0x0;
      this = pPVar14;
    }
LAB_001deb72:
    local_98 = (undefined **)std::ios_base::Init::~Init;
    if (local_50 != local_40) {
      operator_delete(local_50,CONCAT71(local_40._1_7_,local_40[0]) + 1);
    }
    local_98 = (undefined **)local_b8;
    std::locale::~locale(local_60);
    if (EVar9 != eFailure) goto LAB_001debd4;
    if (pPVar14 == (PDFStream *)0x0) {
      pPVar14 = (PDFStream *)0x0;
    }
    else {
      PDFImageXObject::~PDFImageXObject((PDFImageXObject *)pPVar14);
    }
  }
  else {
    pPVar14 = (PDFStream *)0x0;
    this = pPVar14;
  }
  operator_delete(pPVar14,0x20);
  pPVar14 = (PDFStream *)0x0;
LAB_001debd4:
  if (this != (PDFStream *)0x0) {
    PDFStream::~PDFStream(this);
  }
  operator_delete(this,0xf0);
  pppplVar2 = (long ****)local_b0;
  while (pppplVar2 != &local_b0) {
    pppplVar1 = (long ****)*pppplVar2;
    operator_delete(pppplVar2,0x18);
    pppplVar2 = pppplVar1;
  }
  return (PDFImageXObject *)pPVar14;
}

Assistant:

PDFImageXObject* CreateImageXObjectForData(png_structp png_ptr, png_infop info_ptr, png_bytep row, ObjectsContext* inObjectsContext) {
	PDFImageXObjectList listOfImages;
	PDFImageXObject* imageXObject = NULL;
	PDFStream* imageStream = NULL;
	EStatusCode status = eSuccess;

	do
	{

		if (setjmp(png_jmpbuf(png_ptr)))
		{
			// reset failure pointer
			status = eFailure;
			break;
		}

		// get info
		png_uint_32 transformed_width = png_get_image_width(png_ptr, info_ptr);
		png_uint_32 transformed_height = png_get_image_height(png_ptr, info_ptr);
		png_byte transformed_color_type = png_get_color_type(png_ptr, info_ptr);
		png_byte transformed_bit_depth = png_get_bit_depth(png_ptr, info_ptr);
		png_byte channels_count = png_get_channels(png_ptr, info_ptr);
		ObjectIDType imageXObjectObjectId = inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
		// this image has only the color components, use to flag to determine what to ignore
		bool isAlpha = (transformed_color_type & PNG_COLOR_MASK_ALPHA) != 0;
		png_byte colorComponents = isAlpha ? (channels_count - 1) : channels_count;
		ObjectIDType imageMaskObjectId = isAlpha ? inObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID():0;
		MyStringBuf alphaComponentsData;

		status = inObjectsContext->StartNewIndirectObject(imageXObjectObjectId);
		if(status != eSuccess)
		{
			TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image object %ld", imageXObjectObjectId);
			break;
		}
		DictionaryContext* imageContext = inObjectsContext->StartDictionary();

		// type
		imageContext->WriteKey(scType);
		imageContext->WriteNameValue(scXObject);

		// subtype
		imageContext->WriteKey(scSubType);
		imageContext->WriteNameValue(scImage);

		// Width
		imageContext->WriteKey(scWidth);
		imageContext->WriteIntegerValue(transformed_width);

		// Height
		imageContext->WriteKey(scHeight);
		imageContext->WriteIntegerValue(transformed_height);

		// Bits Per Component
		imageContext->WriteKey(scBitsPerComponent);
		imageContext->WriteIntegerValue(transformed_bit_depth);

		// Color Space
		imageContext->WriteKey(scColorSpace);
		imageContext->WriteNameValue(1 == colorComponents ? scDeviceGray : scDeviceRGB);

		// Mask in case of Alpha
		if (isAlpha) {
			imageContext->WriteKey(scSMask);
			imageContext->WriteNewObjectReferenceValue(imageMaskObjectId);
		}

		// now for the image
		imageStream = inObjectsContext->StartPDFStream(imageContext);
		IByteWriter* writerStream = imageStream->GetWriteStream();
		
		png_uint_32 y = transformed_height;

		if (isAlpha) {
			OutputStringBufferStream alphaWriteStream(&alphaComponentsData);

			while (y-- > 0) {
				// read (using "rectangle" method)
				png_read_row(png_ptr, NULL, row);
				// write. iterate per sample, splitting color components and alpha
				for (png_uint_32 i = 0; i < transformed_width; ++i) {
					
					// note that we're writing by color components, but multiply by channel...that's casue we're skipping alpha
					writerStream->Write((IOBasicTypes::Byte*)(row + i*channels_count), colorComponents);
					
					// write out to alpha stream as well (hummfff i don't like this...but i like less to decode the png again....
					// alpha is the last byte, so offset by color components
					alphaWriteStream.Write((IOBasicTypes::Byte*)(row + i*channels_count + colorComponents), 1);
				}
			}
		}
		else {
			while (y-- > 0) {
				// read
				png_read_row(png_ptr, row, NULL);
				// write
				writerStream->Write((IOBasicTypes::Byte*)(row), transformed_width*colorComponents);
			}
		}

		status = inObjectsContext->EndPDFStream(imageStream);
		if(status != eSuccess)
		{
			TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image stream");
			break;
		}

		// if there's a soft mask, write it now
		if (isAlpha) {
			status = inObjectsContext->StartNewIndirectObject(imageMaskObjectId);
			if(status != eSuccess)
			{
				TRACE_LOG1("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not start image mask object %ld", imageMaskObjectId);
				break;
			}
			DictionaryContext* imageMaskContext = inObjectsContext->StartDictionary();

			// type
			imageMaskContext->WriteKey(scType);
			imageMaskContext->WriteNameValue(scXObject);

			// subtype
			imageMaskContext->WriteKey(scSubType);
			imageMaskContext->WriteNameValue(scImage);

			// Width
			imageMaskContext->WriteKey(scWidth);
			imageMaskContext->WriteIntegerValue(transformed_width);

			// Height
			imageMaskContext->WriteKey(scHeight);
			imageMaskContext->WriteIntegerValue(transformed_height);

			// Bits Per Component
			imageMaskContext->WriteKey(scBitsPerComponent);
			imageMaskContext->WriteIntegerValue(transformed_bit_depth);

			// Color Space
			imageMaskContext->WriteKey(scColorSpace);
			imageMaskContext->WriteNameValue(scDeviceGray);

			PDFStream* imageMaskStream = inObjectsContext->StartPDFStream(imageMaskContext);
			IByteWriter* writerMaskStream = imageMaskStream->GetWriteStream();

			// write the alpha samples
			InputStringBufferStream alphaWriteStream(&alphaComponentsData);
			OutputStreamTraits traits(writerMaskStream);
			traits.CopyToOutputStream(&alphaWriteStream);

			status = inObjectsContext->EndPDFStream(imageMaskStream);
			delete imageMaskStream;
			if(status != eSuccess)
			{
				TRACE_LOG("PNGImageHandler::CreateImageXObjectForData. Unexpected Error, could not finalize image mask stream");
				break;
			}
		}

		imageXObject = new PDFImageXObject(imageXObjectObjectId, 1 == colorComponents ? KProcsetImageB : KProcsetImageC);
	} while (false);

	if (eFailure == status) {
		delete imageXObject;
		imageXObject = NULL;
	}
	delete imageStream;
	return imageXObject;
}